

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::GetNavInputAmount2d
                 (ImGuiNavDirSourceFlags dir_sources,ImGuiInputReadMode mode,float slow_factor,
                 float fast_factor)

{
  ImVec2 IVar1;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar8 = 0.0;
  fVar9 = 0.0;
  if ((dir_sources & 1U) != 0) {
    bVar2 = IsKeyDown(0x202);
    bVar3 = IsKeyDown(0x201);
    fVar8 = (float)bVar2 - (float)bVar3;
    bVar2 = IsKeyDown(0x204);
    bVar3 = IsKeyDown(0x203);
    fVar9 = (float)bVar2 - (float)bVar3;
  }
  if ((dir_sources & 2U) != 0) {
    fVar4 = GetNavInputAmount(0x11,mode);
    fVar5 = GetNavInputAmount(0x10,mode);
    fVar6 = GetNavInputAmount(0x13,mode);
    fVar7 = GetNavInputAmount(0x12,mode);
    fVar8 = fVar8 + (fVar4 - fVar5);
    fVar9 = fVar9 + (fVar6 - fVar7);
  }
  if ((dir_sources & 4U) != 0) {
    fVar4 = GetNavInputAmount(5,mode);
    fVar5 = GetNavInputAmount(4,mode);
    fVar6 = GetNavInputAmount(7,mode);
    fVar7 = GetNavInputAmount(6,mode);
    fVar8 = fVar8 + (fVar4 - fVar5);
    fVar9 = fVar9 + (fVar6 - fVar7);
  }
  if ((dir_sources & 8U) != 0) {
    fVar4 = GetNavInputAmount(9,mode);
    fVar5 = GetNavInputAmount(8,mode);
    fVar6 = GetNavInputAmount(0xb,mode);
    fVar7 = GetNavInputAmount(10,mode);
    fVar8 = fVar8 + (fVar4 - fVar5);
    fVar9 = fVar9 + (fVar6 - fVar7);
  }
  if (((slow_factor != 0.0) || (NAN(slow_factor))) && (0.0 < (GImGui->IO).NavInputs[0xe])) {
    fVar8 = fVar8 * slow_factor;
    fVar9 = fVar9 * slow_factor;
  }
  if (((fast_factor != 0.0) || (NAN(fast_factor))) && (0.0 < (GImGui->IO).NavInputs[0xf])) {
    fVar8 = fVar8 * fast_factor;
    fVar9 = fVar9 * fast_factor;
  }
  IVar1.y = fVar9;
  IVar1.x = fVar8;
  return IVar1;
}

Assistant:

ImVec2 ImGui::GetNavInputAmount2d(ImGuiNavDirSourceFlags dir_sources, ImGuiInputReadMode mode, float slow_factor, float fast_factor)
{
    ImVec2 delta(0.0f, 0.0f);
    if (dir_sources & ImGuiNavDirSourceFlags_RawKeyboard)
        delta += ImVec2((float)IsKeyDown(ImGuiKey_RightArrow) - (float)IsKeyDown(ImGuiKey_LeftArrow), (float)IsKeyDown(ImGuiKey_DownArrow) - (float)IsKeyDown(ImGuiKey_UpArrow));
    if (dir_sources & ImGuiNavDirSourceFlags_Keyboard)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_KeyRight_, mode)   - GetNavInputAmount(ImGuiNavInput_KeyLeft_,   mode), GetNavInputAmount(ImGuiNavInput_KeyDown_,   mode) - GetNavInputAmount(ImGuiNavInput_KeyUp_,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadDPad)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_DpadRight, mode)   - GetNavInputAmount(ImGuiNavInput_DpadLeft,   mode), GetNavInputAmount(ImGuiNavInput_DpadDown,   mode) - GetNavInputAmount(ImGuiNavInput_DpadUp,   mode));
    if (dir_sources & ImGuiNavDirSourceFlags_PadLStick)
        delta += ImVec2(GetNavInputAmount(ImGuiNavInput_LStickRight, mode) - GetNavInputAmount(ImGuiNavInput_LStickLeft, mode), GetNavInputAmount(ImGuiNavInput_LStickDown, mode) - GetNavInputAmount(ImGuiNavInput_LStickUp, mode));
    if (slow_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakSlow))
        delta *= slow_factor;
    if (fast_factor != 0.0f && IsNavInputDown(ImGuiNavInput_TweakFast))
        delta *= fast_factor;
    return delta;
}